

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O2

SecretType * __thiscall
duckdb::SecretManager::LookupTypeInternal
          (SecretType *__return_storage_ptr__,SecretManager *this,string *type)

{
  bool bVar1;
  allocator local_39;
  string local_38;
  
  SecretType::SecretType(__return_storage_ptr__);
  bVar1 = TryLookupTypeInternal(this,type,__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::string((string *)&local_38,anon_var_dwarf_3b2a81b + 9,&local_39);
  ThrowTypeNotFoundError(this,type,&local_38);
}

Assistant:

SecretType SecretManager::LookupTypeInternal(const string &type) {
	SecretType return_value;
	if (!TryLookupTypeInternal(type, return_value)) {
		ThrowTypeNotFoundError(type);
	}
	return return_value;
}